

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void pnga_median_patch(Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi,
                      Integer g_c,Integer *clo,Integer *chi,Integer g_m,Integer *mlo,Integer *mhi)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Integer IVar6;
  Integer IVar7;
  Integer IVar8;
  Integer IVar9;
  logical lVar10;
  Integer in_RCX;
  long in_RDX;
  long in_RSI;
  Integer in_RDI;
  long in_R8;
  long in_R9;
  Integer in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  Integer last;
  Integer jtot;
  Integer lod [7];
  Integer idx;
  _iterator_hdl hdl_m;
  _iterator_hdl hdl_c;
  _iterator_hdl hdl_b;
  _iterator_hdl hdl_a;
  int local_sync_end;
  int local_sync_begin;
  Integer num_blocks_m;
  Integer num_blocks_c;
  Integer num_blocks_b;
  Integer num_blocks_a;
  char transp;
  char *tempname;
  Integer compatible;
  Integer type;
  Integer c_temp_created;
  Integer b_temp_created;
  Integer a_temp_created;
  Integer me;
  Integer mtotal;
  Integer ctotal;
  Integer btotal;
  Integer atotal;
  Integer offset;
  char *M_ptr;
  char *C_ptr;
  char *B_ptr;
  char *A_ptr;
  Integer g_M;
  Integer g_C;
  Integer g_B;
  Integer g_A;
  Integer ldM [7];
  Integer hiM [7];
  Integer loM [7];
  Integer ldC [7];
  Integer hiC [7];
  Integer loC [7];
  Integer ldB [7];
  Integer hiB [7];
  Integer loB [7];
  Integer ldA [7];
  Integer hiA [7];
  Integer loA [7];
  Integer mdims [7];
  Integer mndim;
  Integer cdims [7];
  Integer cndim;
  Integer mtype;
  Integer ctype;
  Integer bdims [7];
  Integer bndim;
  Integer adims [7];
  Integer andim;
  Integer btype;
  Integer atype;
  Integer j;
  Integer i;
  char *in_stack_ffffffffffffee68;
  Integer in_stack_ffffffffffffee70;
  void *in_stack_ffffffffffffee78;
  Integer in_stack_ffffffffffffee80;
  Integer aIStack_1178 [2];
  Integer *in_stack_ffffffffffffee98;
  char **in_stack_ffffffffffffeea0;
  Integer *in_stack_ffffffffffffeea8;
  Integer *in_stack_ffffffffffffeeb0;
  _iterator_hdl *in_stack_ffffffffffffeeb8;
  _iterator_hdl *in_stack_ffffffffffffef28;
  Integer in_stack_ffffffffffffef30;
  Integer in_stack_ffffffffffffeff8;
  char *in_stack_fffffffffffff000;
  void *in_stack_fffffffffffff018;
  Integer *in_stack_fffffffffffff020;
  Integer *in_stack_fffffffffffff028;
  Integer *in_stack_fffffffffffff030;
  Integer in_stack_fffffffffffff038;
  Integer in_stack_fffffffffffff040;
  void *in_stack_fffffffffffff050;
  void *in_stack_fffffffffffff058;
  void *in_stack_fffffffffffff060;
  Integer *in_stack_fffffffffffff068;
  Integer *in_stack_fffffffffffff070;
  Integer *in_stack_fffffffffffff078;
  Integer in_stack_fffffffffffff080;
  char *in_stack_fffffffffffff0d8;
  Integer *in_stack_fffffffffffff0e0;
  Integer in_stack_fffffffffffff0e8;
  Integer *in_stack_fffffffffffff168;
  Integer *in_stack_fffffffffffff170;
  Integer in_stack_fffffffffffff178;
  Integer in_stack_fffffffffffff180;
  Integer *in_stack_fffffffffffff240;
  void *in_stack_fffffffffffff248;
  Integer *in_stack_fffffffffffff250;
  Integer *in_stack_fffffffffffff258;
  Integer in_stack_fffffffffffff260;
  Integer *in_stack_fffffffffffff8f8;
  Integer in_stack_fffffffffffff900;
  Integer *in_stack_fffffffffffff908;
  Integer *in_stack_fffffffffffff910;
  Integer in_stack_fffffffffffff918;
  char *in_stack_fffffffffffff920;
  Integer *in_stack_fffffffffffff930;
  long local_4d0;
  long local_4c8;
  long local_4c0;
  long local_4b8;
  Integer local_428 [8];
  Integer local_3e8 [16];
  Integer local_368 [8];
  Integer local_328 [16];
  Integer local_2a8 [8];
  Integer local_268 [16];
  Integer local_1e8 [8];
  Integer local_1a8 [8];
  long local_168 [7];
  long local_130;
  long local_128 [7];
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8 [7];
  long local_a0;
  long local_98 [7];
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  Integer local_28;
  long local_20;
  long local_18;
  Integer local_10;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pnga_nodeid();
  iVar4 = _ga_sync_end;
  iVar5 = _ga_sync_begin;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar5 != 0) {
    pnga_sync();
  }
  pnga_inquire(in_stack_fffffffffffff080,in_stack_fffffffffffff078,in_stack_fffffffffffff070,
               in_stack_fffffffffffff068);
  pnga_inquire(in_stack_fffffffffffff080,in_stack_fffffffffffff078,in_stack_fffffffffffff070,
               in_stack_fffffffffffff068);
  pnga_inquire(in_stack_fffffffffffff080,in_stack_fffffffffffff078,in_stack_fffffffffffff070,
               in_stack_fffffffffffff068);
  pnga_inquire(in_stack_fffffffffffff080,in_stack_fffffffffffff078,in_stack_fffffffffffff070,
               in_stack_fffffffffffff068);
  pnga_inquire(in_stack_fffffffffffff080,in_stack_fffffffffffff078,in_stack_fffffffffffff070,
               in_stack_fffffffffffff068);
  if (local_e8 != local_50) {
    pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
  }
  if (local_e8 != local_58) {
    pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
  }
  if (local_e8 != local_e0) {
    pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
  }
  for (local_40 = 0; local_40 < local_60; local_40 = local_40 + 1) {
    if ((*(long *)(local_18 + local_40 * 8) < 1) ||
       (local_98[local_40] < *(long *)(local_20 + local_40 * 8))) {
      pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    }
  }
  for (local_40 = 0; local_40 < local_a0; local_40 = local_40 + 1) {
    if ((*(long *)(local_30 + local_40 * 8) < 1) ||
       (local_d8[local_40] < *(long *)(local_38 + local_40 * 8))) {
      pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    }
  }
  for (local_40 = 0; local_40 < local_f0; local_40 = local_40 + 1) {
    if ((*(long *)(in_stack_00000010 + local_40 * 8) < 1) ||
       (local_128[local_40] < *(long *)(in_stack_00000018 + local_40 * 8))) {
      pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    }
  }
  for (local_40 = 0; local_40 < local_130; local_40 = local_40 + 1) {
    if ((*(long *)(jtot + local_40 * 8) < 1) ||
       (local_168[local_40] < *(long *)(lod[0] + local_40 * 8))) {
      pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    }
  }
  local_4b8 = 1;
  for (local_40 = 0; local_40 < local_60; local_40 = local_40 + 1) {
    local_4b8 = ((*(long *)(local_20 + local_40 * 8) - *(long *)(local_18 + local_40 * 8)) + 1) *
                local_4b8;
  }
  local_4c0 = 1;
  for (local_40 = 0; local_40 < local_a0; local_40 = local_40 + 1) {
    local_4c0 = ((*(long *)(local_38 + local_40 * 8) - *(long *)(local_30 + local_40 * 8)) + 1) *
                local_4c0;
  }
  local_4c8 = 1;
  for (local_40 = 0; local_40 < local_f0; local_40 = local_40 + 1) {
    local_4c8 = ((*(long *)(in_stack_00000018 + local_40 * 8) -
                 *(long *)(in_stack_00000010 + local_40 * 8)) + 1) * local_4c8;
  }
  local_4d0 = 1;
  for (local_40 = 0; local_40 < local_130; local_40 = local_40 + 1) {
    local_4d0 = ((*(long *)(lod[0] + local_40 * 8) - *(long *)(jtot + local_40 * 8)) + 1) *
                local_4d0;
  }
  if (local_4d0 != local_4b8) {
    pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
  }
  if (local_4d0 != local_4c0) {
    pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
  }
  if (local_4d0 != local_4c8) {
    pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
  }
  IVar6 = pnga_total_blocks(local_10);
  IVar7 = pnga_total_blocks(local_28);
  IVar8 = pnga_total_blocks(in_stack_00000008);
  IVar9 = pnga_total_blocks(last);
  if ((((IVar6 < 0) && (IVar7 < 0)) && (IVar8 < 0)) && (IVar9 < 0)) {
    pnga_distribution(in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170,
                      in_stack_fffffffffffff168);
    pnga_distribution(in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170,
                      in_stack_fffffffffffff168);
    pnga_distribution(in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170,
                      in_stack_fffffffffffff168);
    pnga_distribution(in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170,
                      in_stack_fffffffffffff168);
    lVar10 = pnga_comp_patch(local_60,local_1a8,local_1e8,local_130,local_3e8,local_428);
    pnga_type_f2c(0x3f2);
    pnga_gop(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,
             in_stack_ffffffffffffee68);
    if (lVar10 != 0) {
      lVar10 = pnga_duplicate(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0,
                              in_stack_fffffffffffff0d8);
      if (lVar10 == 0) {
        pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
      }
      pnga_copy_patch(in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                      in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                      in_stack_fffffffffffff930);
      local_60 = local_130;
      bVar1 = true;
      pnga_distribution(in_stack_fffffffffffff180,in_stack_fffffffffffff178,
                        in_stack_fffffffffffff170,in_stack_fffffffffffff168);
    }
    lVar10 = pnga_comp_patch(local_a0,local_268,local_2a8,local_130,local_3e8,local_428);
    pnga_type_f2c(0x3f2);
    pnga_gop(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,
             in_stack_ffffffffffffee68);
    if (lVar10 != 0) {
      lVar10 = pnga_duplicate(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0,
                              in_stack_fffffffffffff0d8);
      if (lVar10 == 0) {
        pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
      }
      pnga_copy_patch(in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                      in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                      in_stack_fffffffffffff930);
      local_a0 = local_130;
      bVar2 = true;
      pnga_distribution(in_stack_fffffffffffff180,in_stack_fffffffffffff178,
                        in_stack_fffffffffffff170,in_stack_fffffffffffff168);
    }
    lVar10 = pnga_comp_patch(local_f0,local_328,local_368,local_130,local_3e8,local_428);
    pnga_type_f2c(0x3f2);
    pnga_gop(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,
             in_stack_ffffffffffffee68);
    if (lVar10 != 0) {
      lVar10 = pnga_duplicate(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0,
                              in_stack_fffffffffffff0d8);
      if (lVar10 == 0) {
        pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
      }
      local_f0 = local_130;
      bVar3 = true;
      pnga_copy_patch(in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                      in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                      in_stack_fffffffffffff930);
      pnga_distribution(in_stack_fffffffffffff180,in_stack_fffffffffffff178,
                        in_stack_fffffffffffff170,in_stack_fffffffffffff168);
    }
    lVar10 = pnga_comp_patch(local_130,local_3e8,local_428,local_60,local_1a8,local_1e8);
    if (lVar10 == 0) {
      pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    }
    lVar10 = pnga_comp_patch(local_130,local_3e8,local_428,local_a0,local_268,local_2a8);
    if (lVar10 == 0) {
      pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    }
    lVar10 = pnga_comp_patch(local_130,local_3e8,local_428,local_f0,local_328,local_368);
    if (lVar10 == 0) {
      pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    }
    if (local_60 < local_130) {
      local_130 = local_60;
    }
    if (local_a0 < local_130) {
      local_130 = local_a0;
    }
    if (local_f0 < local_130) {
      local_130 = local_f0;
    }
    lVar10 = pnga_patch_intersect((Integer *)jtot,(Integer *)lod[0],local_3e8,local_428,local_130);
    if (lVar10 != 0) {
      pnga_access_ptr(in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
                      in_stack_fffffffffffff248,in_stack_fffffffffffff240);
      pnga_access_ptr(in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
                      in_stack_fffffffffffff248,in_stack_fffffffffffff240);
      pnga_access_ptr(in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
                      in_stack_fffffffffffff248,in_stack_fffffffffffff240);
      pnga_access_ptr(in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
                      in_stack_fffffffffffff248,in_stack_fffffffffffff240);
      sgai_median_patch_values
                (in_stack_fffffffffffff040,in_stack_fffffffffffff038,in_stack_fffffffffffff030,
                 in_stack_fffffffffffff028,in_stack_fffffffffffff020,in_stack_fffffffffffff018,
                 in_stack_fffffffffffff050,in_stack_fffffffffffff058,in_stack_fffffffffffff060,
                 (Integer)in_stack_fffffffffffff068);
      pnga_release(in_RDI,local_3e8,local_428);
      pnga_release(in_RCX,local_3e8,local_428);
      pnga_release(in_stack_00000008,local_3e8,local_428);
      pnga_release_update(last,local_3e8,local_428);
    }
  }
  else {
    lVar10 = pnga_duplicate(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0,
                            in_stack_fffffffffffff0d8);
    if (lVar10 == 0) {
      pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    }
    pnga_copy_patch(in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                    in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                    in_stack_fffffffffffff930);
    local_60 = local_130;
    bVar1 = true;
    lVar10 = pnga_duplicate(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0,
                            in_stack_fffffffffffff0d8);
    if (lVar10 == 0) {
      pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    }
    pnga_copy_patch(in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                    in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                    in_stack_fffffffffffff930);
    local_a0 = local_130;
    bVar2 = true;
    lVar10 = pnga_duplicate(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0,
                            in_stack_fffffffffffff0d8);
    if (lVar10 == 0) {
      pnga_error(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    }
    pnga_copy_patch(in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                    in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                    in_stack_fffffffffffff930);
    local_f0 = local_130;
    bVar3 = true;
    pnga_local_iterator_init(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
    pnga_local_iterator_init(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
    pnga_local_iterator_init(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
    pnga_local_iterator_init(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
    while (iVar5 = pnga_local_iterator_next
                             (in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0,
                              in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0,
                              in_stack_ffffffffffffee98), iVar5 != 0) {
      pnga_local_iterator_next
                (in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8,
                 in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
      pnga_local_iterator_next
                (in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8,
                 in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
      pnga_local_iterator_next
                (in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8,
                 in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
      for (local_48 = 0; local_48 < local_130; local_48 = local_48 + 1) {
        aIStack_1178[local_48] = local_3e8[local_48];
      }
      in_stack_ffffffffffffee78 = (void *)(local_130 + -1);
      for (local_48 = 0; local_48 < (long)in_stack_ffffffffffffee78; local_48 = local_48 + 1) {
      }
      sgai_median_patch_values
                (in_stack_fffffffffffff040,in_stack_fffffffffffff038,in_stack_fffffffffffff030,
                 in_stack_fffffffffffff028,in_stack_fffffffffffff020,in_stack_fffffffffffff018,
                 in_stack_fffffffffffff050,in_stack_fffffffffffff058,in_stack_fffffffffffff060,
                 (Integer)in_stack_fffffffffffff068);
    }
  }
  if (bVar1) {
    pnga_destroy((Integer)in_stack_ffffffffffffee78);
  }
  if (bVar2) {
    pnga_destroy((Integer)in_stack_ffffffffffffee78);
  }
  if (bVar3) {
    pnga_destroy((Integer)in_stack_ffffffffffffee78);
  }
  if (iVar4 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_median_patch(
        g_a, alo, ahi, g_b, blo, bhi, g_c, clo, chi, g_m, mlo, mhi)
     Integer g_a, *alo, *ahi;  /* patch of g_a */
     Integer g_b, *blo, *bhi;  /* patch of g_b */
     Integer g_c, *clo, *chi;  /* patch of g_c */
     Integer g_m, *mlo, *mhi;  /* patch of g_m */
{
  Integer i, j;
  Integer atype, btype, andim, adims[MAXDIM], bndim, bdims[MAXDIM];
  Integer ctype, mtype, cndim, cdims[MAXDIM], mndim, mdims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  Integer loB[MAXDIM], hiB[MAXDIM], ldB[MAXDIM];
  Integer loC[MAXDIM], hiC[MAXDIM], ldC[MAXDIM];
  Integer loM[MAXDIM], hiM[MAXDIM], ldM[MAXDIM];
  Integer g_A = g_a, g_B = g_b;
  Integer g_C = g_c, g_M = g_m;
  char *A_ptr, *B_ptr;
  char *C_ptr, *M_ptr;
  Integer offset;
  Integer atotal, btotal;
  Integer ctotal, mtotal;
  Integer me = pnga_nodeid (), a_temp_created = 0, b_temp_created = 0, c_temp_created = 0;
  Integer type = GA_TYPE_GSM, compatible;
  char *tempname = "temp", transp = 'n';        /*no transpose */
  Integer num_blocks_a, num_blocks_b, num_blocks_c, num_blocks_m;
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl_a, hdl_b, hdl_c, hdl_m;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();


  pnga_inquire (g_a, &atype, &andim, adims);
  pnga_inquire (g_b, &btype, &bndim, bdims);
  pnga_inquire (g_c, &ctype, &cndim, cdims);
  pnga_inquire (g_m, &mtype, &mndim, mdims);

  /* I have to inquire the data type again since nga_inquire and
   * nga_inquire_internal_ treat data type differently */
  pnga_inquire(g_m, &type, &mndim, mdims);

  if (mtype != atype)
    pnga_error(" pnga_median_patch:type mismatch ", 0L);
  if (mtype != btype)
    pnga_error(" pnga_median_patch:type mismatch ", 0L);
  if (mtype != ctype)
    pnga_error(" pnga_median_patch:type mismatch ", 0L);

  /* check if patch indices and g_a dims match */
  for (i = 0; i < andim; i++)
    if (alo[i] <= 0 || ahi[i] > adims[i])
    {
      pnga_error("pnga_median_patch: g_a indices out of range ", g_a);
    }

  for (i = 0; i < bndim; i++)
    if (blo[i] <= 0 || bhi[i] > bdims[i])
    {
      pnga_error("pnga_median_patch:g_b indices out of range ", g_b);
    }

  for (i = 0; i < cndim; i++)
    if (clo[i] <= 0 || chi[i] > cdims[i])
    {
      pnga_error("pnga_median_patch:g_c indices out of range ", g_c);
    }         
  for (i = 0; i < mndim; i++)
    if (mlo[i] <= 0 || mhi[i] > mdims[i])
    {
      pnga_error("pnga_median_patch:g_m indices out of range ", g_m);
    }

  /* check if numbers of elements in two patches match each other */

  atotal = 1;
  for (i = 0; i < andim; i++)
    atotal *= (ahi[i] - alo[i] + 1);

  btotal = 1;
  for (i = 0; i < bndim; i++)
    btotal *= (bhi[i] - blo[i] + 1);

  ctotal = 1;
  for (i = 0; i < cndim; i++)
    ctotal *= (chi[i] - clo[i] + 1);

  mtotal = 1;
  for (i = 0; i < mndim; i++)
    mtotal *= (mhi[i] - mlo[i] + 1);


  if (mtotal != atotal)
    pnga_error("pnga_median_patch:  capacities of patches do not match ", 0L);

  if (mtotal != btotal)
    pnga_error("pnga_median_patch:  capacities of patches do not match ", 0L);

  if (mtotal != ctotal)
    pnga_error("pnga_median_patch:  capacities of patches do not match ", 0L);

  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);
  num_blocks_c = pnga_total_blocks(g_c);
  num_blocks_m = pnga_total_blocks(g_m);

  if (num_blocks_a < 0 && num_blocks_b < 0 &&
      num_blocks_c < 0 && num_blocks_m < 0) {
    /* find out coordinates of patches of g_A, g_B, g_C, and g_M that I own */
    pnga_distribution (g_A, me, loA, hiA);
    pnga_distribution (g_B, me, loB, hiB);
    pnga_distribution (g_C, me, loC, hiC);
    pnga_distribution (g_M, me, loM, hiM);

    if (!pnga_comp_patch (andim, loA, hiA, mndim, loM, hiM)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if (!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_a
       *        - copy & reshape patch of g_b into g_B
       */
      if (!pnga_duplicate(g_m, &g_A, tempname))
        pnga_error("pnga_median_patch:duplicate failed", 0L);

      pnga_copy_patch(&transp, g_a, alo, ahi, g_A, mlo, mhi);
      andim = mndim;
      a_temp_created = 1;
      pnga_distribution (g_A, me, loA, hiA);
    }

    if (!pnga_comp_patch (bndim, loB, hiB, mndim, loM, hiM)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if (!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_a
       *        - copy & reshape patch of g_c into g_C
       */
      if (!pnga_duplicate(g_m, &g_B, tempname))
        pnga_error("pnga_median_patch:duplicate failed", 0L);

      pnga_copy_patch(&transp, g_b, blo, bhi, g_B, mlo, mhi);
      bndim = mndim;
      b_temp_created = 1;
      pnga_distribution (g_B, me, loB, hiB);
    }

    if (!pnga_comp_patch (cndim, loC, hiC, mndim, loM, hiM)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if (!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_a
       *        - copy & reshape patch of g_m into g_M
       */
      if (!pnga_duplicate(g_m, &g_C, tempname))
        pnga_error("pnga_median_patch:duplicate failed", 0L);

      /*no need to copy g_m since it is the output matrix. */
      cndim = mndim;
      c_temp_created = 1;
      pnga_copy_patch(&transp, g_c, clo, chi, g_C, mlo, mhi);
      pnga_distribution (g_C, me, loC, hiC);
    }


    if (!pnga_comp_patch (mndim, loM, hiM, andim, loA, hiA))
      pnga_error(" patches mismatch ", 0);
    if (!pnga_comp_patch (mndim, loM, hiM, bndim, loB, hiB))
      pnga_error(" patches mismatch ", 0);
    if (!pnga_comp_patch (mndim, loM, hiM, cndim, loC, hiC))
      pnga_error(" patches mismatch ", 0);


    /* A[83:125,1:1]  <==> B[83:125] */
    if (mndim > andim)
      mndim = andim;            /* need more work */
    if (mndim > bndim)
      mndim = bndim;            /* need more work */
    if (mndim > cndim)
      mndim = cndim;            /* need more work */


    /*  determine subsets of my patches to access  */
    if (pnga_patch_intersect (mlo, mhi, loM, hiM, mndim)) {
      offset = 0;
      pnga_access_ptr (g_A, loM, hiM, &A_ptr, ldA);
      pnga_access_ptr (g_B, loM, hiM, &B_ptr, ldB);
      pnga_access_ptr (g_C, loM, hiM, &C_ptr, ldC);
      pnga_access_ptr (g_M, loM, hiM, &M_ptr, ldM);

      sgai_median_patch_values(type, mndim, loM, hiM, ldM,
          A_ptr, B_ptr, C_ptr, M_ptr, offset);

      /* release access to the data */
      pnga_release (g_A, loM, hiM);
      pnga_release (g_B, loM, hiM);
      pnga_release (g_C, loM, hiM);
      pnga_release_update (g_M, loM, hiM);
    }
  } else {
    /* create copies of A, B, and C that are identically distributed
       as M */
    if (!pnga_duplicate(g_m, &g_A, tempname))
      pnga_error("ga_add_patch: dup failed", 0L);
    pnga_copy_patch(&transp, g_a, alo, ahi, g_A, mlo, mhi);
    andim = mndim;
    a_temp_created = 1;

    if (!pnga_duplicate(g_m, &g_B, tempname))
      pnga_error("ga_add_patch: dup failed", 0L);
    pnga_copy_patch(&transp, g_b, blo, bhi, g_B, mlo, mhi);
    bndim = mndim;
    b_temp_created = 1;

    if (!pnga_duplicate(g_m, &g_C, tempname))
      pnga_error("ga_add_patch: dup failed", 0L);
        pnga_copy_patch(&transp, g_c, clo, chi, g_C, mlo, mhi);
    cndim = mndim;
    c_temp_created = 1;

    /* M is normally distributed so just get the mean using standard approach */
#if 1
    pnga_local_iterator_init(g_A, &hdl_a);
    pnga_local_iterator_init(g_B, &hdl_b);
    pnga_local_iterator_init(g_C, &hdl_c);
    pnga_local_iterator_init(g_m, &hdl_m);
    while(pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA)) {
      pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);
      pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC);
      pnga_local_iterator_next(&hdl_m,loM,hiM,&M_ptr,ldM);
      Integer idx, lod[MAXDIM]/*, hid[MAXDIM]*/;
      Integer jtot, last;
      /* make temporary copies of loM and hiM since pnga_patch_intersect
         destroys original versions */
      for (j=0; j<mndim; j++) {
        lod[j] = loM[j];
        /*hid[j] = hiM[j];*/
      }

      /* evaluate offsets for system */
      offset = 0;
      last = mndim - 1;
      jtot = 1;
      for (j=0; j<last; j++) {
        offset += (loM[j] - lod[j])*jtot;
        jtot *= ldM[j];
      }
      offset += (loM[last]-lod[last])*jtot;

      sgai_median_patch_values(type, mndim, loM, hiM, ldM,
          A_ptr, B_ptr, C_ptr, M_ptr, offset);

    }
#else
    if (num_blocks_m < 0) {
      offset = 0;
      pnga_distribution(g_m, me, loM, hiM);
      if (pnga_patch_intersect (mlo, mhi, loM, hiM, mndim)) {
        pnga_access_ptr (g_A, loM, hiM, &A_ptr, ldA);
        pnga_access_ptr (g_B, loM, hiM, &B_ptr, ldB);
        pnga_access_ptr (g_C, loM, hiM, &C_ptr, ldC);
        pnga_access_ptr (g_M, loM, hiM, &M_ptr, ldM);

        sgai_median_patch_values(type, mndim, loM, hiM, ldM,
            A_ptr, B_ptr, C_ptr, M_ptr, offset);

        /* release access to the data */
        pnga_release (g_A, loM, hiM);
        pnga_release (g_B, loM, hiM);
        pnga_release (g_C, loM, hiM);
        pnga_release_update (g_M, loM, hiM);
      }
    } else {
      Integer idx, lod[MAXDIM]/*, hid[MAXDIM]*/;
      Integer jtot, last, nproc;
      /* Simple block-cyclic data distribution */
      if (!pnga_uses_proc_grid(g_m)) {
        nproc = pnga_nnodes();
        for (idx = me; idx < num_blocks_m; idx += nproc) {
          pnga_distribution(g_m, idx, loM, hiM);
          /* make temporary copies of loM and hiM since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<mndim; j++) {
            lod[j] = loM[j];
            /*hid[j] = hiM[j];*/
          }
          if (pnga_patch_intersect(mlo, mhi, loM, hiM, mndim)) {
            pnga_access_block_ptr(g_A, idx, &A_ptr, ldA);
            pnga_access_block_ptr(g_B, idx, &B_ptr, ldB);
            pnga_access_block_ptr(g_C, idx, &C_ptr, ldC);
            pnga_access_block_ptr(g_m, idx, &M_ptr, ldM);

            /* evaluate offsets for system */
            offset = 0;
            last = mndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loM[j] - lod[j])*jtot;
              jtot *= ldM[j];
            }
            offset += (loM[last]-lod[last])*jtot;

            sgai_median_patch_values(type, mndim, loM, hiM, ldM,
                A_ptr, B_ptr, C_ptr, M_ptr, offset);

            /* release access to the data */
            pnga_release_block (g_A, idx);
            pnga_release_block (g_B, idx);
            pnga_release_block (g_C, idx);
            pnga_release_update_block (g_M, idx);
          }
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer lod[MAXDIM]/*, hid[MAXDIM], chk*/;
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM];
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        pnga_get_proc_index(g_m, me, proc_index);
        pnga_get_proc_index(g_m, me, index);
        pnga_get_block_info(g_m, blocks, block_dims);
        pnga_get_proc_grid(g_m, topology);

        while (index[mndim-1] < blocks[mndim-1]) {
          /* find bounding coordinates of block */
          /*chk = 1;*/
          for (i = 0; i < mndim; i++) {
            loM[i] = index[i]*block_dims[i]+1;
            hiM[i] = (index[i] + 1)*block_dims[i];
            if (hiM[i] > mdims[i]) hiM[i] = mdims[i];
            /*if (hiM[i] < loM[i]) chk = 0;*/
          }
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<mndim; j++) {
            lod[j] = loM[j];
            /*hid[j] = hiM[j];*/
          }
          if (pnga_patch_intersect(mlo, mhi, loM, hiM, mndim)) {
            pnga_access_block_grid_ptr(g_A, index, &A_ptr, ldA);
            pnga_access_block_grid_ptr(g_B, index, &B_ptr, ldB);
            pnga_access_block_grid_ptr(g_C, index, &C_ptr, ldC);
            pnga_access_block_grid_ptr(g_m, index, &M_ptr, ldM);

            /* evaluate offsets for system */
            offset = 0;
            last = mndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loM[j] - lod[j])*jtot;
              jtot *= ldM[j];
            }
            offset += (loM[last]-lod[last])*jtot;

            sgai_median_patch_values(type, mndim, loM, hiM, ldM,
                A_ptr, B_ptr, C_ptr, M_ptr, offset);

            /* release access to the data */
            pnga_release_block_grid (g_A, index);
            pnga_release_block_grid (g_B, index);
            pnga_release_block_grid (g_C, index);
            pnga_release_update_block_grid (g_M, index);
          }

          /* increment index to get next block on processor */
          index[0] += topology[0];
          for (i = 0; i < mndim; i++) {
            if (index[i] >= blocks[i] && i<mndim-1) {
              index[i] = proc_index[i];
              index[i+1] += topology[i+1];
            }
          }
        }
      }
    }
#endif
  }
  if (a_temp_created)
    pnga_destroy (g_A);
  if (b_temp_created)
    pnga_destroy (g_B);
  if (c_temp_created)
    pnga_destroy (g_C);
  if(local_sync_end)pnga_sync();
}